

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O1

void write_cb(uv_write_t *req,int status)

{
  void *pvVar1;
  undefined8 *extraout_RDX;
  int iVar2;
  ulong uVar3;
  undefined8 *__size;
  uv_shutdown_t *puVar4;
  undefined8 uStack_18;
  code *pcStack_10;
  
  uVar3 = (ulong)(uint)status;
  if (req == (uv_write_t *)0x0) {
    pcStack_10 = (code *)0x1ce200;
    write_cb_cold_2();
  }
  else if (status == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  iVar2 = (int)uVar3;
  puVar4 = (uv_shutdown_t *)(uVar3 & 0xffffffff);
  pcStack_10 = shutdown_cb;
  write_cb_cold_1();
  if (puVar4 == &shutdown_req) {
    pcStack_10 = (code *)(long)iVar2;
    uStack_18 = 0;
    if (pcStack_10 != (code *)0x0) goto LAB_001ce28a;
    pcStack_10 = (code *)(shutdown_req.handle)->write_queue_size;
    uStack_18 = 0;
    if (pcStack_10 == (code *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      pcStack_10 = (code *)(long)write_cb_called;
      uStack_18 = 3;
      if (pcStack_10 == (code *)0x3) {
        return;
      }
      goto LAB_001ce2a8;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_001ce28a:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_001ce2a8:
  __size = &uStack_18;
  shutdown_cb_cold_4();
  pvVar1 = malloc((size_t)__size);
  *extraout_RDX = pvVar1;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void write_cb(uv_fs_t* req) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  ASSERT_UINT64_EQ(2, metrics.loop_count);
  ASSERT_UINT64_GT(metrics.events, last_events_count);
  ASSERT_EQ(req->result, sizeof(test_buf));

  uv_fs_req_cleanup(req);
  last_events_count = metrics.events;

  ASSERT_OK(uv_fs_close(uv_default_loop(),
                        &fs_reqs.close_req,
                        (uv_os_fd_t) fs_reqs.open_req.result,
                        close_cb));
}